

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O2

llb_build_value * llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo)

{
  BuildValue *this;
  long lVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  byte bVar4;
  FileInfo in_stack_fffffffffffffed8;
  uint64_t local_d8;
  uint64_t uStack_d0;
  uint64_t local_c8;
  uint64_t uStack_c0;
  uint64_t local_b8;
  uint64_t uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  BuildValue local_80;
  
  bVar4 = 0;
  this = (BuildValue *)operator_new(0x70);
  local_d8 = fileInfo.device;
  uStack_d0 = fileInfo.inode;
  local_c8 = fileInfo.mode;
  uStack_c0 = fileInfo.size;
  local_b8 = fileInfo.modTime.seconds;
  uStack_b0 = fileInfo.modTime.nanoseconds;
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  uStack_90 = 0;
  puVar2 = &local_d8;
  puVar3 = (uint64_t *)&stack0xfffffffffffffed8;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    *puVar3 = *puVar2;
    puVar2 = puVar2 + (ulong)bVar4 * -2 + 1;
    puVar3 = puVar3 + (ulong)bVar4 * -2 + 1;
  }
  llbuild::buildsystem::BuildValue::makeExistingInput(in_stack_fffffffffffffed8);
  llbuild::buildsystem::BuildValue::BuildValue(this,&local_80);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_80);
  return (llb_build_value *)this;
}

Assistant:

llb_build_value *llb_build_value_make_existing_input(llb_build_value_file_info_t fileInfo) {
  return (llb_build_value *)new CAPIBuildValue(BuildValue::makeExistingInput(convertFileInfo(fileInfo)));
}